

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktUniformBlockTests.cpp
# Opt level: O0

void __thiscall
vkt::ubo::anon_unknown_0::BlockMultiBasicTypesCase::BlockMultiBasicTypesCase
          (BlockMultiBasicTypesCase *this,TestContext *testCtx,string *name,string *description,
          deUint32 flagsA,deUint32 flagsB,BufferMode bufferMode,int numInstances,
          MatrixLoadFlags matrixLoadFlag)

{
  UniformBlock *pUVar1;
  allocator<char> local_469;
  string local_468;
  VarType local_448;
  allocator<char> local_429;
  string local_428;
  Uniform local_408;
  VarType local_3c8;
  allocator<char> local_3a9;
  string local_3a8;
  Uniform local_388;
  VarType local_348;
  allocator<char> local_329;
  string local_328;
  Uniform local_308;
  VarType local_2c8;
  allocator<char> local_2a9;
  string local_2a8;
  Uniform local_288;
  allocator<char> local_241;
  string local_240;
  UniformBlock *local_220;
  UniformBlock *blockB;
  string local_210;
  VarType local_1f0;
  allocator<char> local_1d1;
  string local_1d0;
  Uniform local_1b0;
  VarType local_170;
  allocator<char> local_151;
  string local_150;
  Uniform local_130;
  VarType local_f0;
  allocator<char> local_d1;
  string local_d0;
  Uniform local_b0;
  allocator<char> local_59;
  string local_58;
  UniformBlock *local_38;
  UniformBlock *blockA;
  deUint32 flagsB_local;
  deUint32 flagsA_local;
  string *description_local;
  string *name_local;
  TestContext *testCtx_local;
  BlockMultiBasicTypesCase *this_local;
  
  blockA._0_4_ = flagsB;
  blockA._4_4_ = flagsA;
  _flagsB_local = description;
  description_local = name;
  name_local = (string *)testCtx;
  testCtx_local = (TestContext *)this;
  UniformBlockCase::UniformBlockCase
            (&this->super_UniformBlockCase,testCtx,name,description,bufferMode,matrixLoadFlag,false)
  ;
  (this->super_UniformBlockCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BlockMultiBasicTypesCase_016ab820;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"BlockA",&local_59);
  pUVar1 = ShaderInterface::allocBlock(&(this->super_UniformBlockCase).m_interface,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  local_38 = pUVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"a",&local_d1);
  VarType::VarType(&local_f0,TYPE_FLOAT,4);
  Uniform::Uniform(&local_b0,&local_d0,&local_f0,0);
  UniformBlock::addUniform(pUVar1,&local_b0);
  Uniform::~Uniform(&local_b0);
  VarType::~VarType(&local_f0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  pUVar1 = local_38;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"b",&local_151);
  VarType::VarType(&local_170,TYPE_UINT_VEC3,1);
  Uniform::Uniform(&local_130,&local_150,&local_170,0x1800);
  UniformBlock::addUniform(pUVar1,&local_130);
  Uniform::~Uniform(&local_130);
  VarType::~VarType(&local_170);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator(&local_151);
  pUVar1 = local_38;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"c",&local_1d1);
  VarType::VarType(&local_1f0,TYPE_FLOAT_MAT2,2);
  Uniform::Uniform(&local_1b0,&local_1d0,&local_1f0,0);
  UniformBlock::addUniform(pUVar1,&local_1b0);
  Uniform::~Uniform(&local_1b0);
  VarType::~VarType(&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  pUVar1 = local_38;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,"blockA",(allocator<char> *)((long)&blockB + 7));
  UniformBlock::setInstanceName(pUVar1,&local_210);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator((allocator<char> *)((long)&blockB + 7));
  UniformBlock::setFlags(local_38,blockA._4_4_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_240,"BlockB",&local_241);
  pUVar1 = ShaderInterface::allocBlock(&(this->super_UniformBlockCase).m_interface,&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  std::allocator<char>::~allocator(&local_241);
  local_220 = pUVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"a",&local_2a9);
  VarType::VarType(&local_2c8,TYPE_FLOAT_MAT3,2);
  Uniform::Uniform(&local_288,&local_2a8,&local_2c8,0);
  UniformBlock::addUniform(pUVar1,&local_288);
  Uniform::~Uniform(&local_288);
  VarType::~VarType(&local_2c8);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::allocator<char>::~allocator(&local_2a9);
  pUVar1 = local_220;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_328,"b",&local_329);
  VarType::VarType(&local_348,TYPE_INT_VEC2,1);
  Uniform::Uniform(&local_308,&local_328,&local_348,0);
  UniformBlock::addUniform(pUVar1,&local_308);
  Uniform::~Uniform(&local_308);
  VarType::~VarType(&local_348);
  std::__cxx11::string::~string((string *)&local_328);
  std::allocator<char>::~allocator(&local_329);
  pUVar1 = local_220;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3a8,"c",&local_3a9);
  VarType::VarType(&local_3c8,TYPE_FLOAT_VEC4,4);
  Uniform::Uniform(&local_388,&local_3a8,&local_3c8,0x1800);
  UniformBlock::addUniform(pUVar1,&local_388);
  Uniform::~Uniform(&local_388);
  VarType::~VarType(&local_3c8);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::allocator<char>::~allocator(&local_3a9);
  pUVar1 = local_220;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_428,"d",&local_429);
  VarType::VarType(&local_448,TYPE_BOOL,0);
  Uniform::Uniform(&local_408,&local_428,&local_448,0);
  UniformBlock::addUniform(pUVar1,&local_408);
  Uniform::~Uniform(&local_408);
  VarType::~VarType(&local_448);
  std::__cxx11::string::~string((string *)&local_428);
  std::allocator<char>::~allocator(&local_429);
  pUVar1 = local_220;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_468,"blockB",&local_469);
  UniformBlock::setInstanceName(pUVar1,&local_468);
  std::__cxx11::string::~string((string *)&local_468);
  std::allocator<char>::~allocator(&local_469);
  UniformBlock::setFlags(local_220,(deUint32)blockA);
  if (0 < numInstances) {
    UniformBlock::setArraySize(local_38,numInstances);
    UniformBlock::setArraySize(local_220,numInstances);
  }
  (*(this->super_UniformBlockCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[2])()
  ;
  return;
}

Assistant:

BlockMultiBasicTypesCase (tcu::TestContext& testCtx, const std::string& name, const std::string& description, deUint32 flagsA, deUint32 flagsB, BufferMode bufferMode, int numInstances, MatrixLoadFlags matrixLoadFlag)
		: UniformBlockCase	(testCtx, name, description, bufferMode, matrixLoadFlag)
	{
		UniformBlock& blockA = m_interface.allocBlock("BlockA");
		blockA.addUniform(Uniform("a", VarType(glu::TYPE_FLOAT, PRECISION_HIGH)));
		blockA.addUniform(Uniform("b", VarType(glu::TYPE_UINT_VEC3, PRECISION_LOW), UNUSED_BOTH));
		blockA.addUniform(Uniform("c", VarType(glu::TYPE_FLOAT_MAT2, PRECISION_MEDIUM)));
		blockA.setInstanceName("blockA");
		blockA.setFlags(flagsA);

		UniformBlock& blockB = m_interface.allocBlock("BlockB");
		blockB.addUniform(Uniform("a", VarType(glu::TYPE_FLOAT_MAT3, PRECISION_MEDIUM)));
		blockB.addUniform(Uniform("b", VarType(glu::TYPE_INT_VEC2, PRECISION_LOW)));
		blockB.addUniform(Uniform("c", VarType(glu::TYPE_FLOAT_VEC4, PRECISION_HIGH), UNUSED_BOTH));
		blockB.addUniform(Uniform("d", VarType(glu::TYPE_BOOL, 0)));
		blockB.setInstanceName("blockB");
		blockB.setFlags(flagsB);

		if (numInstances > 0)
		{
			blockA.setArraySize(numInstances);
			blockB.setArraySize(numInstances);
		}

		init();
	}